

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::ShiftExp(SQCompiler *this)

{
  long lVar1;
  long *in_RDI;
  SQOpcode in_stack_0000000c;
  SQCompiler *in_stack_00000010;
  SQCompiler *in_stack_ffffffffffffffd0;
  SQInteger in_stack_fffffffffffffff0;
  long *f;
  
  f = in_RDI;
  PlusExp(in_stack_ffffffffffffffd0);
  while( true ) {
    while( true ) {
      while (lVar1 = *in_RDI, lVar1 == 0x128) {
        BIN_EXP<void(SQCompiler::*)()>
                  (in_stack_00000010,in_stack_0000000c,(offset_in_SQCompiler_to_subr)f,
                   in_stack_fffffffffffffff0);
      }
      if (lVar1 != 0x129) break;
      BIN_EXP<void(SQCompiler::*)()>
                (in_stack_00000010,in_stack_0000000c,(offset_in_SQCompiler_to_subr)f,
                 in_stack_fffffffffffffff0);
    }
    if (lVar1 != 0x132) break;
    in_stack_fffffffffffffff0 = 0;
    BIN_EXP<void(SQCompiler::*)()>
              (in_stack_00000010,in_stack_0000000c,(offset_in_SQCompiler_to_subr)f,0);
  }
  return;
}

Assistant:

void ShiftExp()
    {
        PlusExp();
        for(;;) switch(_token) {
        case TK_USHIFTR: BIN_EXP(_OP_BITW, &SQCompiler::PlusExp,BW_USHIFTR); break;
        case TK_SHIFTL: BIN_EXP(_OP_BITW, &SQCompiler::PlusExp,BW_SHIFTL); break;
        case TK_SHIFTR: BIN_EXP(_OP_BITW, &SQCompiler::PlusExp,BW_SHIFTR); break;
        default: return;
        }
    }